

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_filter.cpp
# Opt level: O2

string * __thiscall
duckdb::InFilter::ToString(string *__return_storage_ptr__,InFilter *this,string *column_name)

{
  pointer pVVar1;
  Value *val;
  pointer this_00;
  string in_list;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pVVar1 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pVVar1; this_00 = this_00 + 1) {
    if (local_70._M_string_length != 0) {
      ::std::__cxx11::string::append((char *)&local_70);
    }
    Value::ToSQLString_abi_cxx11_(&local_90,this_00);
    ::std::__cxx11::string::append((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  ::std::operator+(&local_50,column_name," IN (");
  ::std::operator+(&local_90,&local_50,&local_70);
  ::std::operator+(__return_storage_ptr__,&local_90,")");
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string InFilter::ToString(const string &column_name) const {
	string in_list;
	for (auto &val : values) {
		if (!in_list.empty()) {
			in_list += ", ";
		}
		in_list += val.ToSQLString();
	}
	return column_name + " IN (" + in_list + ")";
}